

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_setop.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundSetOperationNode *node)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  Binder *pBVar4;
  size_type sVar5;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  long in_RSI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> in_RDI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000080;
  vector<duckdb::LogicalType,_true> *in_stack_00000088;
  vector<duckdb::LogicalType,_true> *in_stack_00000090;
  Binder *in_stack_00000098;
  templated_unique_single_t root;
  LogicalOperatorType logical_type;
  templated_unique_single_t right_projection;
  templated_unique_single_t left_projection;
  idx_t i;
  vector<duckdb::LogicalType,_true> right_types;
  vector<duckdb::LogicalType,_true> left_types;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> right_node
  ;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> left_node;
  unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>_>
  *in_stack_fffffffffffffdb8;
  unique_ptr<duckdb::LogicalSetOperation,_std::default_delete<duckdb::LogicalSetOperation>_> *puVar6
  ;
  Binder *in_stack_fffffffffffffdc0;
  value_type *in_stack_fffffffffffffdc8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_fffffffffffffdd0;
  byte local_209;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffe10;
  unsigned_long *in_stack_fffffffffffffe18;
  BoundQueryNode *in_stack_fffffffffffffe20;
  Binder *in_stack_fffffffffffffe28;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_fffffffffffffe30;
  pointer in_stack_fffffffffffffe38;
  unsigned_long *in_stack_fffffffffffffe40;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_fffffffffffffe48;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_fffffffffffffe60;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> local_d0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_ffffffffffffff38;
  BoundQueryNode *in_stack_ffffffffffffff40;
  Binder *in_stack_ffffffffffffff48;
  unsigned_long local_a8 [2];
  idx_t local_98;
  idx_t local_80;
  ulong local_70;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_18;
  
  bVar1 = *(byte *)(in_RSI + 0x221);
  local_18 = in_RDX;
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffdc0);
  pBVar4->is_outside_flattened = (bool)(bVar1 & 1);
  bVar1 = *(byte *)(in_RSI + 0x221);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffdc0);
  pBVar4->is_outside_flattened = (bool)(bVar1 & 1);
  shared_ptr<duckdb::Binder,_true>::operator->
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffdc0);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffdc0);
  CreatePlan(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  shared_ptr<duckdb::Binder,_true>::operator->
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffdc0);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffdc0);
  CreatePlan(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  bVar3 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)in_stack_fffffffffffffdd0);
  if (bVar3) {
    in_stack_fffffffffffffe38 =
         unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
         operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                     *)in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffe28 = (Binder *)(local_18 + 8);
    in_stack_fffffffffffffe30 = &local_d0;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdc0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdb8);
    CastLogicalOperatorToTypes
              (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdc0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8492);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e849f);
    unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
    operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                *)in_stack_fffffffffffffdc0);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdc0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdb8);
    CastLogicalOperatorToTypes
              (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdc0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8538);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8545);
  }
  else {
    vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x19e7f1f);
    vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x19e7f2c);
    for (local_70 = 0; uVar2 = local_70,
        sVar5 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)(local_18 + 0x13)), uVar2 < sVar5; local_70 = local_70 + 1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffdc0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffdc0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    }
    local_80 = GenerateTableIndex(in_stack_fffffffffffffdc0);
    make_uniq<duckdb::LogicalProjection,unsigned_long,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>::
    operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                *)in_stack_fffffffffffffdc0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 *)in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
    unique_ptr<duckdb::LogicalProjection,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
              ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdc0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e812b);
    local_98 = GenerateTableIndex(in_stack_fffffffffffffdc0);
    make_uniq<duckdb::LogicalProjection,unsigned_long,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>::
    operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                *)in_stack_fffffffffffffdc0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 *)in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
    unique_ptr<duckdb::LogicalProjection,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
              ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdc0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e81e9);
    in_stack_fffffffffffffe60 = local_18 + 8;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdc0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdb8);
    CastLogicalOperatorToTypes
              (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    in_stack_fffffffffffffe40 = local_a8;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdc0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8273);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8280);
    in_stack_fffffffffffffe48 = local_18 + 8;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdc0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffdb8);
    CastLogicalOperatorToTypes
              (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdc0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8302);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e830f);
    unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                 *)0x19e831c);
    unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                 *)0x19e8329);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x19e8336);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x19e8343);
  }
  local_209 = 1;
  if ((*(byte *)(in_RSI + 0x220) & 1) == 0) {
    pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffdc0);
    local_209 = 1;
    if ((pBVar4->has_unplanned_dependent_joins & 1U) == 0) {
      pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                         ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffdc0);
      local_209 = pBVar4->has_unplanned_dependent_joins;
    }
  }
  *(byte *)(in_RSI + 0x220) = local_209 & 1;
  switch(*(undefined1 *)
          &local_18[0xb].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
  case 1:
  case 4:
    break;
  case 2:
    break;
  case 3:
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_18 + 8));
  puVar6 = (unique_ptr<duckdb::LogicalSetOperation,_std::default_delete<duckdb::LogicalSetOperation>_>
            *)((long)&local_18[0xb].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 1);
  make_uniq<duckdb::LogicalSetOperation,unsigned_long&,unsigned_long,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::LogicalOperatorType&,bool&>
            ((unsigned_long *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (LogicalOperatorType *)in_stack_fffffffffffffe28,(bool *)in_stack_fffffffffffffe60);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalSetOperation,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            (local_18,puVar6);
  VisitQueryNode(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0x19e8744);
  unique_ptr<duckdb::LogicalSetOperation,_std::default_delete<duckdb::LogicalSetOperation>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalSetOperation,_std::default_delete<duckdb::LogicalSetOperation>,_true>
               *)0x19e8751);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0x19e875e);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0x19e876b);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundSetOperationNode &node) {
	// Generate the logical plan for the left and right sides of the set operation
	node.left_binder->is_outside_flattened = is_outside_flattened;
	node.right_binder->is_outside_flattened = is_outside_flattened;

	auto left_node = node.left_binder->CreatePlan(*node.left);
	auto right_node = node.right_binder->CreatePlan(*node.right);

	// Add a new projection to child node
	D_ASSERT(node.left_reorder_exprs.size() == node.right_reorder_exprs.size());
	if (!node.left_reorder_exprs.empty()) {
		D_ASSERT(node.setop_type == SetOperationType::UNION_BY_NAME);
		vector<LogicalType> left_types;
		vector<LogicalType> right_types;
		// We are going to add a new projection operator, so collect the type
		// of reorder exprs in order to call CastLogicalOperatorToTypes()
		for (idx_t i = 0; i < node.left_reorder_exprs.size(); ++i) {
			left_types.push_back(node.left_reorder_exprs[i]->return_type);
			right_types.push_back(node.right_reorder_exprs[i]->return_type);
		}

		auto left_projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(node.left_reorder_exprs));
		left_projection->children.push_back(std::move(left_node));
		left_node = std::move(left_projection);

		auto right_projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(node.right_reorder_exprs));
		right_projection->children.push_back(std::move(right_node));
		right_node = std::move(right_projection);

		left_node = CastLogicalOperatorToTypes(left_types, node.types, std::move(left_node));
		right_node = CastLogicalOperatorToTypes(right_types, node.types, std::move(right_node));
	} else {
		left_node = CastLogicalOperatorToTypes(node.left->types, node.types, std::move(left_node));
		right_node = CastLogicalOperatorToTypes(node.right->types, node.types, std::move(right_node));
	}

	// check if there are any unplanned subqueries left in either child
	has_unplanned_dependent_joins = has_unplanned_dependent_joins || node.left_binder->has_unplanned_dependent_joins ||
	                                node.right_binder->has_unplanned_dependent_joins;

	// create actual logical ops for setops
	LogicalOperatorType logical_type = LogicalOperatorType::LOGICAL_INVALID;
	switch (node.setop_type) {
	case SetOperationType::UNION:
	case SetOperationType::UNION_BY_NAME:
		logical_type = LogicalOperatorType::LOGICAL_UNION;
		break;
	case SetOperationType::EXCEPT:
		logical_type = LogicalOperatorType::LOGICAL_EXCEPT;
		break;
	case SetOperationType::INTERSECT:
		logical_type = LogicalOperatorType::LOGICAL_INTERSECT;
		break;
	default:
		D_ASSERT(false);
		break;
	}

	auto root = make_uniq<LogicalSetOperation>(node.setop_index, node.types.size(), std::move(left_node),
	                                           std::move(right_node), logical_type, node.setop_all);

	return VisitQueryNode(node, std::move(root));
}